

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O1

INode * __thiscall
COLLADASaxFWL::FormulasLoader::createMultiOperandOperation
          (FormulasLoader *this,NodeVector *nodes,Operator op)

{
  INode *pIVar1;
  
  if ((op < POW) && ((0x3fefU >> (op & SEC) & 1) != 0)) {
    pIVar1 = (INode *)(**(code **)((long)(this->super_HelperLoaderBase)._vptr_HelperLoaderBase +
                                  *(long *)(&DAT_0085bf58 + (ulong)op * 8)))();
    return pIVar1;
  }
  return (INode *)0x0;
}

Assistant:

MathML::AST::INode* FormulasLoader::createMultiOperandOperation( const NodeVector& nodes, Operator op )
	{
		MathML::AST::INode* node;
		switch ( op )
		{
		case ADD:
		case SUB:
		case MUL:
		case DIV:
			node = createArithmeticOperation( nodes, op );
			break;
		case AND:
		case OR:
		case XOR:
			node = createLogicOperation( nodes, op );
			break;
		case EQ:
		case NEQ:
		case LT:
		case LTE:
		case GT:
		case GTE:
			node = createBinaryComparisonOperation( nodes, op );
			break;
		default:
			// invalid operator
			node = 0;
		}

		return node;
	}